

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixCase::createInstance(ShaderMatrixCase *this,Context *context)

{
  ulong uVar1;
  bool bVar2;
  Precision PVar3;
  Precision PVar4;
  MatrixOp MVar5;
  int iVar6;
  ShaderEvaluator *evaluator;
  _func_int **pp_Var7;
  undefined8 uVar8;
  float *pfVar9;
  int iVar10;
  OperationType OVar11;
  ShaderRenderCaseInstance *this_00;
  TestInstance *pTVar12;
  ShaderRenderCaseInstance *pSVar13;
  InternalError *this_01;
  deUint32 bindingLocation;
  float *pfVar14;
  ulong uVar15;
  UniformSetup *pUVar16;
  int row;
  long lVar17;
  long lVar18;
  float *pfVar19;
  int row_1;
  long lVar20;
  UniformSetup local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = (ShaderRenderCaseInstance *)operator_new(0x230);
  bVar2 = (this->super_ShaderRenderCase).m_isVertexCase;
  evaluator = (this->super_ShaderRenderCase).m_evaluator.
              super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
              .m_data.ptr;
  pp_Var7 = *(_func_int ***)&this->m_in0;
  PVar3 = (this->m_in0).precision;
  PVar4 = (this->m_in1).precision;
  uVar8 = *(undefined8 *)&this->m_in1;
  MVar5 = this->m_op;
  UniformSetup::UniformSetup(&local_78,(UniformSetupFunc)0x0);
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (this_00,context,bVar2,evaluator,&local_78,(AttributeSetupFunc)0x0,
             IMAGE_BACKING_MODE_REGULAR,(uint)(byte)(MVar5 == OP_INVERSE & bVar2) << 6);
  UniformSetup::~UniformSetup(&local_78);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00d5b658;
  this_00[1].super_TestInstance._vptr_TestInstance = pp_Var7;
  *(Precision *)&this_00[1].super_TestInstance.m_context = PVar3;
  *(undefined8 *)((long)&this_00[1].super_TestInstance.m_context + 4) = uVar8;
  this_00[1].m_quadGridSize = PVar4;
  *(MatrixOp *)
   &this_00[1].m_sparseContext.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
    .m_data.ptr = MVar5;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (&this_00->m_userAttribTransforms,4);
  pfVar9 = (float *)(this_00->m_userAttribTransforms).
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pfVar14 = pfVar9;
  uVar15 = 0;
  do {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78._vptr_UniformSetup = (_func_int **)0x0;
    local_78.m_setupFunc = (UniformSetupFunc)0x0;
    lVar17 = 0;
    pUVar16 = &local_78;
    do {
      lVar18 = 0;
      do {
        *(undefined4 *)((long)&pUVar16->_vptr_UniformSetup + lVar18) = 0;
        lVar18 = lVar18 + 0x10;
      } while (lVar18 != 0x40);
      lVar17 = lVar17 + 1;
      pUVar16 = (UniformSetup *)((long)&pUVar16->_vptr_UniformSetup + 4);
    } while (lVar17 != 4);
    lVar17 = 0;
    pUVar16 = &local_78;
    pfVar19 = pfVar14;
    do {
      lVar18 = 0;
      do {
        *(undefined4 *)((long)pfVar19 + lVar18) =
             *(undefined4 *)((long)&pUVar16->_vptr_UniformSetup + lVar18);
        lVar18 = lVar18 + 0x10;
      } while (lVar18 != 0x40);
      lVar17 = lVar17 + 1;
      pfVar19 = pfVar19 + 1;
      pUVar16 = (UniformSetup *)((long)&pUVar16->_vptr_UniformSetup + 4);
    } while (lVar17 != 4);
    (pfVar9 + uVar15 * 0x10 + 0xc)[0] = 0.2;
    (pfVar9 + uVar15 * 0x10 + 0xc)[1] = 0.1;
    pfVar9[uVar15 * 0x10 + 0xe] = (float)(int)uVar15 * 0.15 + 0.4;
    pfVar9[uVar15 * 0x10 + 0xf] = 0.7;
    pfVar9[uVar15 * 0x11] = 1.0;
    uVar1 = uVar15 + 1;
    pfVar9[uVar15 * 0x10 + (ulong)((uint)uVar1 & 3) + 4] = 1.0;
    pfVar9[uVar15 * 0x10 + (uVar15 ^ 2) + 8] = 1.0;
    pfVar9[uVar15 * 0x10 + (ulong)((int)uVar15 - 1U & 3) + 0xc] = 1.0;
    pfVar14 = pfVar14 + 0x10;
    uVar15 = uVar1;
  } while (uVar1 != 4);
  MVar5 = *(MatrixOp *)
           &this_00[1].m_sparseContext.
            super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
            .m_data.ptr;
  switch(MVar5) {
  case OP_ADD:
  case OP_SUB:
  case OP_MUL:
  case OP_DIV:
  case OP_COMP_MUL:
  case OP_OUTER_PRODUCT:
  case OP_TRANSPOSE:
  case OP_INVERSE:
  case OP_DETERMINANT:
  case OP_POST_DECREMENT:
  case OP_ADD_INTO:
    iVar10 = 0;
    bVar2 = true;
    goto LAB_005c4490;
  case OP_UNARY_PLUS:
  case OP_DIVIDE_INTO:
    iVar10 = 3;
    break;
  case OP_NEGATION:
    iVar10 = 4;
    break;
  case OP_PRE_INCREMENT:
  case OP_POST_INCREMENT:
  case OP_MULTIPLY_INTO:
    iVar10 = 1;
    break;
  case OP_PRE_DECREMENT:
    iVar10 = 2;
    break;
  case OP_SUBTRACT_FROM:
    iVar10 = 5;
    break;
  default:
    iVar10 = 6;
  }
  bVar2 = false;
LAB_005c4490:
  if (!bVar2) {
    lVar17 = 0;
    do {
      lVar18 = 0;
      do {
        lVar20 = 0;
        do {
          if (iVar10 - 1U < 5) {
            pTVar12 = (TestInstance *)
                      (*(code *)(&DAT_00b4c0e4 + *(int *)(&DAT_00b4c0e4 + (ulong)(iVar10 - 1U) * 4))
                      )(0x80000000,0x3e99999a,0xbe99999a,0xbdcccccd);
            return pTVar12;
          }
          lVar20 = lVar20 + 0x10;
        } while (lVar20 != 0x40);
        lVar18 = lVar18 + 1;
      } while (lVar18 != 4);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
  }
  OVar11 = MatrixCaseUtils::getOperationType(MVar5);
  iVar10 = 1;
  if (OVar11 < OPERATIONTYPE_LAST) {
    iVar10 = *(int *)(&DAT_00b4c560 + (ulong)OVar11 * 4);
  }
  bindingLocation = 4;
  do {
    pSVar13 = (ShaderRenderCaseInstance *)((long)&this_00[1].super_TestInstance.m_context + 4);
    if (bindingLocation == 4) {
      pSVar13 = this_00 + 1;
    }
    if (*(int *)&(pSVar13->super_TestInstance)._vptr_TestInstance == 2) {
      iVar6 = *(int *)((long)&(pSVar13->super_TestInstance)._vptr_TestInstance + 4);
      if (iVar6 - 5U < 9 || iVar6 - 0x12U < 9) {
        if (8 < iVar6 - 5U) {
          this_01 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (this_01,"Not supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderMatrixTests.cpp"
                     ,0x563);
          __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        }
        ShaderRenderCaseInstance::useAttribute(this_00,bindingLocation,iVar6 - A_IN1);
      }
    }
    iVar6 = bindingLocation - iVar10;
    bindingLocation = bindingLocation + 1;
  } while (iVar6 != 3);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* ShaderMatrixCase::createInstance (Context& context) const
{
	return new ShaderMatrixInstance(context, m_isVertexCase, *m_evaluator, m_in0, m_in1, m_op);
}